

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<Reason>::growTo(vec<Reason> *this,uint size,Reason *pad)

{
  ulong uVar1;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar1 = (ulong)this->sz;
    if (this->sz < size) {
      do {
        this->data[uVar1].field_0 = pad->field_0;
        uVar1 = uVar1 + 1;
      } while (size != uVar1);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}